

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O2

void __thiscall
chatra::emb::io::StandardFileCommon::seek
          (StandardFileCommon *this,ptrdiff_t offset,SeekOrigin origin)

{
  int iVar1;
  IllegalArgumentException *this_00;
  undefined8 *puVar2;
  pointer_____offset_0x10___ *ppuVar3;
  
  if ((FILE *)this->fp == (FILE *)0x0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar2[4] = 0;
    puVar2[1] = puVar2 + 3;
    *(undefined1 *)(puVar2 + 3) = 0;
    *puVar2 = &PTR__NativeException_0023dae0;
    ppuVar3 = &UnsupportedOperationException::typeinfo;
  }
  else {
    if (origin == Current) {
      offset = offset + this->current;
    }
    else if (origin == End) {
      offset = offset + this->length;
    }
    else if (origin != Begin) {
      offset = 0;
    }
    if ((offset < 0) || (this->length < (ulong)offset)) {
      this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
      IllegalArgumentException::IllegalArgumentException(this_00,"specified offset is out of range")
      ;
      __cxa_throw(this_00,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
    }
    iVar1 = fseek((FILE *)this->fp,offset,0);
    if (iVar1 == 0) {
      this->current = offset;
      return;
    }
    (*(this->super_IFile)._vptr_IFile[2])(this);
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar2[4] = 0;
    *puVar2 = &PTR__NativeException_0023cea0;
    puVar2[1] = puVar2 + 3;
    *(undefined1 *)(puVar2 + 3) = 0;
    ppuVar3 = &NativeException::typeinfo;
  }
  __cxa_throw(puVar2,ppuVar3,NativeException::~NativeException);
}

Assistant:

void seek(ptrdiff_t offset, SeekOrigin origin) override {
		if (fp == nullptr)
			throw UnsupportedOperationException();

		ptrdiff_t newPosition = 0;
		switch (origin) {
		case SeekOrigin::Begin:
			newPosition = offset;  break;
		case SeekOrigin::End:
			newPosition = length + offset;  break;
		case SeekOrigin::Current:
			newPosition = current + offset;  break;
		}
		if (newPosition < 0 || length < static_cast<size_t>(newPosition))
			throw IllegalArgumentException("specified offset is out of range");

		if (std::fseek(fp, static_cast<long>(newPosition), SEEK_SET)) {
			close();
			throw NativeException();
		}

		current = static_cast<size_t>(newPosition);
	}